

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O2

void Fraig_NodeVecSortByLevel(Fraig_NodeVec_t *p,int fIncreasing)

{
  code *__compar;
  
  __compar = Fraig_NodeVecCompareLevelsIncreasing;
  if (fIncreasing == 0) {
    __compar = Fraig_NodeVecCompareLevelsDecreasing;
  }
  qsort(p->pArray,(long)p->nSize,8,__compar);
  return;
}

Assistant:

void Fraig_NodeVecSortByLevel( Fraig_NodeVec_t * p, int fIncreasing )
{
    if ( fIncreasing )
        qsort( (void *)p->pArray, p->nSize, sizeof(Fraig_Node_t *), 
                (int (*)(const void *, const void *)) Fraig_NodeVecCompareLevelsIncreasing );
    else 
        qsort( (void *)p->pArray, p->nSize, sizeof(Fraig_Node_t *), 
                (int (*)(const void *, const void *)) Fraig_NodeVecCompareLevelsDecreasing );
}